

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v10::detail::
    get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
              (basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg)

{
  ulong uVar1;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  precision_checker local_1;
  
  switch(arg.value_.field_0.int128_value._8_4_) {
  case 1:
    uVar1 = precision_checker::operator()<int,_0>(&local_1,in_stack_00000008);
    break;
  case 2:
    uVar1 = (ulong)in_stack_00000008;
    break;
  case 3:
    uVar1 = precision_checker::operator()<long_long,_0>
                      (&local_1,CONCAT44(in_stack_0000000c,in_stack_00000008));
    break;
  case 5:
    if (arg.value_.field_0.long_long_value < 0) {
      throw_format_error("negative precision");
    }
  case 4:
  case 6:
    uVar1 = CONCAT44(in_stack_0000000c,in_stack_00000008);
    break;
  default:
    throw_format_error("precision is not integer");
  }
  if (uVar1 >> 0x1f == 0) {
    return (int)uVar1;
  }
  throw_format_error("number is too big");
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg) -> int {
  unsigned long long value = visit_format_arg(Handler(), arg);
  if (value > to_unsigned(max_value<int>()))
    throw_format_error("number is too big");
  return static_cast<int>(value);
}